

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  byte bVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  mbedtls_mpi_uint d;
  ulong local_48;
  mbedtls_mpi T;
  
  iVar2 = -4;
  if (0xfffffff0 < radix - 0x11U) {
    T.s = 1;
    T.n = 0;
    T.p = (mbedtls_mpi_uint *)0x0;
    cVar1 = *s;
    if (cVar1 == '\0') {
      mbedtls_mpi_free(X);
      iVar2 = 0;
    }
    else {
      sVar3 = strlen(s + (cVar1 == '-'));
      if (radix == 0x10) {
        if (sVar3 >> 0x3e != 0) {
          return -4;
        }
        iVar2 = mbedtls_mpi_grow(X,((sVar3 >> 4) + 1) - (ulong)((sVar3 & 0xf) == 0));
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_lset(X,0), iVar2 == 0)) {
          pcVar6 = s + (cVar1 == '-') + sVar3;
          bVar5 = 0;
          for (uVar8 = 0; pcVar6 = pcVar6 + -1, sVar3 != uVar8; uVar8 = uVar8 + 1) {
            iVar2 = mpi_get_digit(&d,0x10,*pcVar6);
            if (iVar2 != 0) goto LAB_00f05c76;
            X->p[uVar8 >> 4] = X->p[uVar8 >> 4] | d << (bVar5 & 0x3c);
            bVar5 = bVar5 + 4;
          }
LAB_00f05cec:
          iVar2 = 0;
          if ((cVar1 == '-') && (sVar4 = mbedtls_mpi_bitlen(X), sVar4 != 0)) {
            X->s = -1;
          }
        }
      }
      else {
        iVar2 = mbedtls_mpi_lset(X,0);
        if (iVar2 == 0) {
          local_48 = (ulong)(uint)radix;
          sVar7 = 0;
          do {
            if (sVar3 == sVar7) goto LAB_00f05cec;
            iVar2 = mpi_get_digit(&d,radix,(s + (cVar1 == '-'))[sVar7]);
            if (iVar2 != 0) break;
            iVar2 = mbedtls_mpi_mul_int(&T,X,local_48);
            if (iVar2 != 0) break;
            iVar2 = mbedtls_mpi_add_int(X,&T,d);
            sVar7 = sVar7 + 1;
          } while (iVar2 == 0);
        }
      }
LAB_00f05c76:
      mbedtls_mpi_free(&T);
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}